

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O3

void __thiscall dna_string::dna_string(dna_string *this,string *path,char TERM)

{
  pointer pcVar1;
  pointer ppVar2;
  pointer puVar3;
  ulong uVar4;
  uint uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ostream *poVar8;
  undefined7 in_register_00000011;
  size_type __n;
  ostream *poVar9;
  char c;
  string BUF;
  ifstream ifs;
  allocator_type local_27e;
  allocator_type local_27d;
  undefined4 local_27c;
  string local_278;
  string local_258;
  vector<p_rank,_std::allocator<p_rank>_> local_238 [21];
  
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nbytes = 0;
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->data = (uint8_t *)0x0;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_superblocks = 0;
  this->n_blocks = 0;
  this->n = 0;
  local_27c = (undefined4)CONCAT71(in_register_00000011,TERM);
  this->TERM = TERM;
  pcVar1 = (path->_M_dataplus)._M_p;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar1,pcVar1 + path->_M_string_length);
  uVar6 = filesize(&local_258);
  this->n = uVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
    uVar6 = this->n;
  }
  uVar7 = uVar6 + 1;
  __n = ((uVar7 >> 0x20) + 1) - (ulong)((int)uVar7 == 0);
  uVar6 = ((uVar7 >> 7) + 1) - (ulong)((uVar7 & 0x7f) == 0);
  this->n_superblocks = __n;
  this->n_blocks = uVar6;
  this->nbytes = uVar6 * 0x40;
  std::vector<p_rank,_std::allocator<p_rank>_>::vector(local_238,__n,(allocator_type *)&local_278);
  ppVar2 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
    if (local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_278._M_dataplus._M_p = local_278._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,this->nbytes + 0x40,
             (value_type_conflict1 *)&local_278,&local_27d);
  puVar3 = (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
    if (local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238[0].super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  puVar3 = (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->data = puVar3 + (-(int)puVar3 & 0x3f);
  std::ifstream::ifstream(local_238,(string *)path,_S_in);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_278,-0x80);
  if (this->n != 0) {
    uVar7 = 0;
    do {
      std::istream::read((char *)local_238,(long)&local_27e);
      uVar5 = (uint)uVar7 & 0x7f;
      *(allocator_type *)(local_278._M_dataplus._M_p + uVar5) = local_27e;
      if (((0x13 < (byte)local_27e - 0x41) ||
          ((0x80045U >> ((byte)local_27e - 0x41 & 0x1f) & 1) == 0)) &&
         (local_27e != local_27c._0_1_)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error while reading file: read forbidden character \'",
                   0x34);
        local_27d = local_27e;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_27d,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' (ASCII code ",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)(char)local_27e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Only A,C,G,T, and ",0x12);
        local_27d = SUB41(local_27c,0);
        poVar9 = (ostream *)&std::cout;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_27d,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," are admitted in the input BWT!",0x1f);
        std::endl<char,std::char_traits<char>>(poVar8);
        if (local_27e == (allocator_type)0x4e) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Possible solution: it seems that your file contains \'N\' characters. Please, re-run with option -n."
                     ,0x62);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Possible solution: if the unknown character is the terminator, you can solve the problem by adding option \"-t "
                     ,0x6e);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(char)local_27e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".",2);
        }
        std::endl<char,std::char_traits<char>>(poVar9);
        exit(1);
      }
      if (uVar5 == 0x7f) {
        set(this,uVar7 >> 7,&local_278);
      }
      uVar7 = uVar7 + 1;
      uVar4 = this->n;
    } while (uVar7 < uVar4);
    if ((uVar4 & 0x7f) != 0) {
      set(this,uVar4 >> 7,&local_278);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  build_rank_support(this);
  return;
}

Assistant:

dna_string(string path, char TERM = '#'){

		this->TERM = TERM;

		n = uint64_t(filesize(path));

		n_superblocks = (n+1)/SUPERBLOCK_SIZE + ((n+1)%SUPERBLOCK_SIZE != 0);
		n_blocks = (n+1)/BLOCK_SIZE + ((n+1)%BLOCK_SIZE != 0);
		nbytes = (n_blocks * BYTES_PER_BLOCK);//number of bytes effectively filled with data

		superblock_ranks = vector<p_rank>(n_superblocks);

		/*
		 * this block of code ensures that data is aligned by 64 bytes = 512 bits
		 */
		memory = vector<uint8_t>(nbytes+ALN,0);
		data = memory.data();
		while(uint64_t(data) % ALN != 0) data++;

		//cout << "alignment of data: " << (void*)data << endl;

		{

			ifstream ifs(path);

			string BUF(BLOCK_SIZE,'A');

			for(uint64_t i = 0; i<n; ++i){

				char c;

				ifs.read((char*)&c, sizeof(char));

				BUF[i%BLOCK_SIZE] = c;

				if(c!='A' and c!='C' and c!='G' and c!='T' and c!=TERM){
					cout << "Error while reading file: read forbidden character '" <<  c << "' (ASCII code " << int(c) << ")." << endl;
					cout << "Only A,C,G,T, and " << TERM << " are admitted in the input BWT!" << endl;

					if(c=='N'){

						cout << "Possible solution: it seems that your file contains 'N' characters. Please, re-run with option -n." << endl;

					}else{

						cout << "Possible solution: if the unknown character is the terminator, you can solve the problem by adding option \"-t " << int(c) << "\"." << endl;

					}

					exit(1);
				}

				//buffer is full
				if((i%BLOCK_SIZE) == BLOCK_SIZE-1) set(i/BLOCK_SIZE, BUF);

			}

			if(n % BLOCK_SIZE != 0) set(n/BLOCK_SIZE, BUF);

		}

		assert(check_content(path));
		build_rank_support();

	}